

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O1

void __thiscall
ConfidentialTransactionController_UnblindTransaction_Test::TestBody
          (ConfidentialTransactionController_UnblindTransaction_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  _func_int **pp_Var3;
  Amount AVar4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> privkeys;
  ConfidentialTransactionController txc;
  AssertHelper local_f0;
  string local_e8;
  undefined1 local_c8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> local_a8;
  int local_8c;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> local_88;
  ConfidentialTransactionController local_68;
  
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,
             "020000000102b5e7e11dd2ae7ed6dfa754d406d240fe8cd0ab1e329cee6edbeffad5e54a4ac7000000006a47304402203d0d7240234aa446a08c1d6107789405c0f3499f4f5dd61fd7318ba58bb21bae02203d2e5a37c704c95af5801618edfb2184d80871b79a160f9dbc8a8e0a90467b380121030ab052e1482e9715c05301b07cf531d6a7e343bb508f0f2ba9126118c15be5bffdffffffd007d56e9e984c52b4e077487a711ff0c7126da52f254ea4d532dafd78748d2c0000000000fdffffff030b48263bdde648e0ba73cb63b44410ad1941fc1304bcba6665be398db23a702a300979f67b8612d871d2dbe646debe1c07717b0429f5afcc7889d84572e9657176d803430e3f6e47f856ef7a1b2928783e2ddcb8acff8e402e1d8c4c22b078e8ea36ea1976a91410eb66140b970b99b072d25fd4f07b4e88db32c088ac0bc322eb24c971bfd454fd61577b70eafab7a7c42f3b973cf57b3e56a002c4adb00802025d289a81f637f62c55500d6e439a9e13743ef7753d728866acc58b459b6d028a3e9de7bddcb400f3c1534270d9063dc465bd06a3da50278013a0ff4a5823b617a914862432e4a10eb1ca46c2e97525ab27a13abaffc987017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000009da8000002000000000000000000024730440220761eb444887bd22ed0a3fc05caf4b9e74fa879db2b6cba70747f9aeae40848c00220070205b4817123234536efe00ec778240a87e5d8b5b9f9e155e892767ee922f20121026e3ab12d8a898ac99e71bbca0843cf749009025381a2a109cf0d1c2bfd5f86b300630200036507e368fd17b9db49f8f108b7dc78af4cbbdf67227d77658e2da045ea665cb0a34bcbf77b32c0b3dec83385b8d14a641e926951cf08099dc5e22205db641a8e5ca94ef7ea313435be5541e2b6a5b9b199750921f65dd1030fa4abde717a29bffd4d0b60230000000000000001ecb2010aa97ea3544b1ac0c9a3321a3f05c6accd4436f7944d670b15c32d3f0541ae8779ae3f6105b01085df24aa249b7d12238fa8a775f06815e2818eb4af3ef8f075d1f0d3fe89fd5567cc8c6b4cf4f48d11fea10809ca06f7bf47290c5182516a0d797fb43a80af28f221dd09628f21cb0b98e7b82567d8e28dc2b494c1dd248cc56a9307c39974da90050d2312cb2858e86de0d393ccfda7ba3b368729d4e9b3972393e05e6ccd623e8dd035205ba554c099948bd8992d20030e145b95e64c3d91f6e3217d099ba5a0a64fabe2f2172102097160ec40baee5f5db764abc2f666cc22c20258797d623f413e399a0377561633b68f2057ee74b1d2f1b040e49b5e3df38b612439d25ab332ef9aeec15e6292d84acf5a3faa4d4a7df5d9bea923340363ad0d6ced0e274adbc82c7cfb4801..." /* TRUNCATED STRING LITERAL */
             ,"");
  cfd::ConfidentialTransactionController::ConfidentialTransactionController(&local_68,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  local_88.super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8 = (undefined1  [8])&local_b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c8,"86f51824f47012cda257c2db9988850f1fa08da00b139ccae7eaf1f5e8364c65",
             "");
  cfd::core::Privkey::Privkey((Privkey *)&local_e8,(string *)local_c8,kMainnet,true);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::
  emplace_back<cfd::core::Privkey>(&local_88,(Privkey *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (local_c8 != (undefined1  [8])&local_b8) {
    operator_delete((void *)local_c8);
  }
  local_c8 = (undefined1  [8])&local_b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c8,"4caed85937d0270835d8b8cb1a5182dc2280a5857bacac8224b5362eb4170818",
             "");
  cfd::core::Privkey::Privkey((Privkey *)&local_e8,(string *)local_c8,kMainnet,true);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::
  emplace_back<cfd::core::Privkey>(&local_88,(Privkey *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (local_c8 != (undefined1  [8])&local_b8) {
    operator_delete((void *)local_c8);
  }
  cfd::core::Privkey::Privkey((Privkey *)&local_e8);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::
  emplace_back<cfd::core::Privkey>(&local_88,(Privkey *)&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::ConfidentialTransactionController::UnblindTransaction
                ((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                  *)local_c8,&local_68,&local_88);
      local_e8.field_2._M_allocated_capacity =
           (size_type)
           local_a8.
           super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_e8._M_string_length =
           (size_type)
           local_a8.
           super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_e8._M_dataplus._M_p =
           (pointer)local_a8.
                    super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_a8.
      super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_c8;
      local_a8.
      super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)sStack_c0.ptr_;
      local_a8.
      super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._M_allocated_capacity;
      local_c8 = (undefined1  [8])0x0;
      sStack_c0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_b8._M_allocated_capacity = 0;
      std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
      ~vector((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
              &local_e8);
      std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
      ~vector((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
              local_c8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0xbe,
               "Expected: unblind_params = txc.UnblindTransaction(privkeys) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c8,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_e8._M_dataplus._M_p + 8))();
      }
      local_e8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            (&local_e8,
             &(local_a8.
               super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
               ._M_impl.super__Vector_impl_data._M_start)->asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_c8,"unblind_params[0].asset.GetHex().c_str()",
             "\"186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179\"",
             local_e8._M_dataplus._M_p,
             "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (local_c8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if ((pointer)sStack_c0.ptr_ == (pointer)0x0) {
      pp_Var3 = (_func_int **)0x62864a;
    }
    else {
      pp_Var3 = ((ConfidentialAssetId *)&(sStack_c0.ptr_)->_M_dataplus)->_vptr_ConfidentialAssetId;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0xc1,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_e8._M_dataplus._M_p + 8))();
      }
      local_e8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  AVar4 = cfd::core::ConfidentialValue::GetAmount
                    ((ConfidentialValue *)
                     ((long)local_a8.
                            super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                            ._M_impl.super__Vector_impl_data._M_start + 0x68));
  local_c8 = (undefined1  [8])AVar4.amount_;
  sStack_c0.ptr_._0_1_ = AVar4.ignore_check_;
  local_f0.data_ = (AssertHelperData *)cfd::core::Amount::GetSatoshiValue((Amount *)local_c8);
  local_8c = 100000000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&local_e8,"unblind_params[0].value.GetAmount().GetSatoshiValue()",
             "100000000",(long *)&local_f0,&local_8c);
  if ((char)local_e8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_c8);
    if ((pointer)local_e8._M_string_length == (pointer)0x0) {
      pp_Var3 = (_func_int **)0x62864a;
    }
    else {
      pp_Var3 = ((ConfidentialAssetId *)local_e8._M_string_length)->_vptr_ConfidentialAssetId;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0xc2,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_c8 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
      local_c8 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            (&local_e8,
             (ConfidentialAssetId *)
             ((long)local_a8.
                    super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0x90));
  testing::internal::CmpHelperSTREQ
            ((internal *)local_c8,"unblind_params[1].asset.GetHex().c_str()",
             "\"186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179\"",
             local_e8._M_dataplus._M_p,
             "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (local_c8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_e8);
    if ((pointer)sStack_c0.ptr_ == (pointer)0x0) {
      pp_Var3 = (_func_int **)0x62864a;
    }
    else {
      pp_Var3 = ((ConfidentialAssetId *)&(sStack_c0.ptr_)->_M_dataplus)->_vptr_ConfidentialAssetId;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0xc5,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_e8._M_dataplus._M_p + 8))();
      }
      local_e8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  AVar4 = cfd::core::ConfidentialValue::GetAmount
                    ((ConfidentialValue *)
                     ((long)local_a8.
                            super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                            ._M_impl.super__Vector_impl_data._M_start + 0xf8));
  local_c8 = (undefined1  [8])AVar4.amount_;
  sStack_c0.ptr_._0_1_ = AVar4.ignore_check_;
  local_f0.data_ = (AssertHelperData *)cfd::core::Amount::GetSatoshiValue((Amount *)local_c8);
  local_8c = 0x5f506b8;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&local_e8,"unblind_params[1].value.GetAmount().GetSatoshiValue()",
             "99944120",(long *)&local_f0,&local_8c);
  if ((char)local_e8._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_c8);
    if ((pointer)local_e8._M_string_length == (pointer)0x0) {
      pp_Var3 = (_func_int **)0x62864a;
    }
    else {
      pp_Var3 = ((ConfidentialAssetId *)local_e8._M_string_length)->_vptr_ConfidentialAssetId;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0xc6,(char *)pp_Var3);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if (local_c8 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_c8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_c8 + 8))();
      }
      local_c8 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_e8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::~vector
            (&local_a8);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::~vector(&local_88);
  local_68.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&PTR__ConfidentialTransactionController_00735388;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_68.transaction_);
  return;
}

Assistant:

TEST(ConfidentialTransactionController, AddPegoutTxOut)
{
    ConfidentialTransactionController txc(2, 0);
    Address addr;
    txc.AddTxIn(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0, 4294967293);
    txc.AddTxOut(
        Address("XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", cfd::core::GetElementsAddressFormatList()),
        Amount::CreateBySatoshiAmount(209998999992700),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
    txc.AddPegoutTxOut(
        Amount::CreateBySatoshiAmount(1000000000),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"),
        BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
        Address("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo"),
        NetType::kRegtest,
        Pubkey("0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        Privkey::FromWif("cVPA9nh4bHhKXinBCLkJJTD3UgfiizWRykXfFegwZzKMNYAKG9RL", NetType::kRegtest),
        "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))",
        0,
        ByteData("030e07d4f657c0c169e04fac5d5a8096adb099874834be59ad1e681e22d952ccda0214156e4ae9168289b4d0c034da94025121d33ad8643663454885032d77640e3d"),
        NetType::kElementsRegtest,
        &addr);
    txc.AddTxOutFee(
        Amount::CreateBySatoshiAmount(7300),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

    EXPECT_STREQ(txc.GetHex().c_str(), "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00009e6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da872103700dcb030588ed828d85f645b48971de0d31e8c0244da46710d18681627f5a4a4101044e949dcf8ac2daac82a3e4999ee28e2711661793570c4daab34cd38d76a425d6bfe102f3fea8be12109925fad32c78b65afea4de1d17a826e7375d0e2d00660125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000");
    EXPECT_STREQ(addr.GetAddress().c_str(), "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo");
}